

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_descriptor.hpp
# Opt level: O2

size_t __thiscall
boost::asio::posix::stream_descriptor::read_some<boost::asio::mutable_buffers_1>
          (stream_descriptor *this,mutable_buffers_1 *buffers)

{
  size_t sVar1;
  error_code ec;
  error_code local_28;
  
  local_28.m_val = 0;
  local_28.m_cat = system::system_category();
  sVar1 = detail::reactive_descriptor_service::read_some<boost::asio::mutable_buffers_1>
                    ((this->super_descriptor).
                     super_basic_io_object<boost::asio::detail::reactive_descriptor_service,_true>.
                     service_,&(this->super_descriptor).
                               super_basic_io_object<boost::asio::detail::reactive_descriptor_service,_true>
                               .implementation_,buffers,&local_28);
  detail::throw_error(&local_28,"read_some");
  return sVar1;
}

Assistant:

std::size_t read_some(const MutableBufferSequence& buffers)
  {
    boost::system::error_code ec;
    std::size_t s = this->get_service().read_some(
        this->get_implementation(), buffers, ec);
    boost::asio::detail::throw_error(ec, "read_some");
    return s;
  }